

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoration_manager.cpp
# Opt level: O0

void __thiscall
spvtools::opt::analysis::DecorationManager::CloneDecorations
          (DecorationManager *this,uint32_t from,uint32_t to,
          vector<spv::Decoration,_std::allocator<spv::Decoration>_> *decorations_to_copy)

{
  Module *this_00;
  initializer_list<unsigned_int> init_list;
  bool bVar1;
  Op OVar2;
  uint32_t from_00;
  IRContext *this_01;
  pointer ppVar3;
  IRContext *c;
  Instruction *pIVar4;
  pointer this_02;
  iterator *piVar5;
  reference ppIVar6;
  Instruction *inst_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range2_1;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  indirect_decorations;
  iterator_template<spvtools::opt::Instruction> local_d8;
  iterator decoration_iter;
  uint32_t local_c4;
  iterator local_c0;
  undefined8 local_b8;
  SmallVector<unsigned_int,_2UL> local_b0;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_88;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> new_inst;
  Decoration local_74;
  __normal_iterator<const_spv::Decoration_*,_std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>
  local_70;
  __normal_iterator<const_spv::Decoration_*,_std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>
  local_68;
  __normal_iterator<const_spv::Decoration_*,_std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>
  local_60;
  Instruction *local_58;
  Instruction *inst;
  iterator __end2;
  iterator __begin2;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range2;
  IRContext *context;
  _Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
  local_28;
  iterator decoration_list;
  vector<spv::Decoration,_std::allocator<spv::Decoration>_> *decorations_to_copy_local;
  uint32_t to_local;
  uint32_t from_local;
  DecorationManager *this_local;
  
  decoration_list.
  super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
             )(_Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
               )decorations_to_copy;
  decorations_to_copy_local._0_4_ = to;
  decorations_to_copy_local._4_4_ = from;
  _to_local = this;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>_>
       ::find(&this->id_to_decoration_insts_,(key_type *)((long)&decorations_to_copy_local + 4));
  context = (IRContext *)
            std::
            unordered_map<unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>_>
            ::end(&this->id_to_decoration_insts_);
  bVar1 = std::__detail::operator==
                    (&local_28,
                     (_Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                      *)&context);
  if (!bVar1) {
    this_01 = Module::context(this->module_);
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false,_false>
                           *)&local_28);
    __end2 = std::
             vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
             begin(&(ppVar3->second).direct_decorations);
    inst = (Instruction *)
           std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
           ::end(&(ppVar3->second).direct_decorations);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                                       *)&inst), bVar1) {
      ppIVar6 = __gnu_cxx::
                __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                ::operator*(&__end2);
      local_58 = *ppIVar6;
      local_68._M_current =
           (Decoration *)
           std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>::begin
                     ((vector<spv::Decoration,_std::allocator<spv::Decoration>_> *)
                      decoration_list.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                      ._M_cur);
      local_70._M_current =
           (Decoration *)
           std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>::end
                     ((vector<spv::Decoration,_std::allocator<spv::Decoration>_> *)
                      decoration_list.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                      ._M_cur);
      local_74 = opt::Instruction::GetSingleWordInOperand(local_58,1);
      local_60 = std::
                 find<__gnu_cxx::__normal_iterator<spv::Decoration_const*,std::vector<spv::Decoration,std::allocator<spv::Decoration>>>,spv::Decoration>
                           (local_68,local_70,&local_74);
      new_inst._M_t.
      super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
           (__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
            )std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>::end
                       ((vector<spv::Decoration,_std::allocator<spv::Decoration>_> *)
                        decoration_list.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                        ._M_cur);
      bVar1 = __gnu_cxx::operator==
                        (&local_60,
                         (__normal_iterator<const_spv::Decoration_*,_std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>
                          *)&new_inst);
      pIVar4 = local_58;
      if (!bVar1) {
        c = Module::context(this->module_);
        pIVar4 = opt::Instruction::Clone(pIVar4,c);
        std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
        ::unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
                  ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
                    *)&local_88,pIVar4);
        this_02 = std::
                  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  ::operator->(&local_88);
        local_c4 = (uint32_t)decorations_to_copy_local;
        local_c0 = &local_c4;
        local_b8 = 1;
        init_list._M_len = 1;
        init_list._M_array = local_c0;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_b0,init_list);
        opt::Instruction::SetInOperand(this_02,0,&local_b0);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_b0);
        this_00 = this->module_;
        std::
        unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
        unique_ptr((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                    *)&decoration_iter,&local_88);
        Module::AddAnnotationInst
                  (this_00,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                            *)&decoration_iter);
        std::
        unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
        ~unique_ptr((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                     *)&decoration_iter);
        Module::annotation_end
                  ((Module *)
                   &indirect_decorations.
                    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        piVar5 = InstructionList::iterator::operator--
                           ((iterator *)
                            &indirect_decorations.
                             super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        InstructionList::iterator::iterator((iterator *)&local_d8,piVar5);
        pIVar4 = utils::IntrusiveList<spvtools::opt::Instruction>::
                 iterator_template<spvtools::opt::Instruction>::operator*(&local_d8);
        IRContext::AnalyzeUses(this_01,pIVar4);
        std::
        unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
        ~unique_ptr(&local_88);
      }
      __gnu_cxx::
      __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
      ::operator++(&__end2);
    }
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false,_false>
                           *)&local_28);
    std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::vector
              ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                *)&__range2_1,&(ppVar3->second).indirect_decorations);
    __end2_1 = std::
               vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
               begin((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                      *)&__range2_1);
    inst_1 = (Instruction *)
             std::
             vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
             end((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                  *)&__range2_1);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                               *)&inst_1), bVar1) {
      ppIVar6 = __gnu_cxx::
                __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                ::operator*(&__end2_1);
      pIVar4 = *ppIVar6;
      OVar2 = opt::Instruction::opcode(pIVar4);
      if (OVar2 != OpGroupDecorate) {
        if (OVar2 == OpGroupMemberDecorate) {
          __assert_fail("false && \"The source id is not suppose to be a type.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/decoration_manager.cpp"
                        ,0x252,
                        "void spvtools::opt::analysis::DecorationManager::CloneDecorations(uint32_t, uint32_t, const std::vector<spv::Decoration> &)"
                       );
        }
        __assert_fail("false && \"Unexpected decoration instruction\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/decoration_manager.cpp"
                      ,0x256,
                      "void spvtools::opt::analysis::DecorationManager::CloneDecorations(uint32_t, uint32_t, const std::vector<spv::Decoration> &)"
                     );
      }
      from_00 = opt::Instruction::GetSingleWordInOperand(pIVar4,0);
      CloneDecorations(this,from_00,(uint32_t)decorations_to_copy_local,
                       (vector<spv::Decoration,_std::allocator<spv::Decoration>_> *)
                       decoration_list.
                       super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                       ._M_cur);
      __gnu_cxx::
      __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
      ::operator++(&__end2_1);
    }
    std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
    ~vector((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
            &__range2_1);
  }
  return;
}

Assistant:

void DecorationManager::CloneDecorations(
    uint32_t from, uint32_t to,
    const std::vector<spv::Decoration>& decorations_to_copy) {
  const auto decoration_list = id_to_decoration_insts_.find(from);
  if (decoration_list == id_to_decoration_insts_.end()) return;
  auto context = module_->context();
  for (Instruction* inst : decoration_list->second.direct_decorations) {
    if (std::find(decorations_to_copy.begin(), decorations_to_copy.end(),
                  spv::Decoration(inst->GetSingleWordInOperand(1))) ==
        decorations_to_copy.end()) {
      continue;
    }

    // Clone decoration and change |target-id| to |to|.
    std::unique_ptr<Instruction> new_inst(inst->Clone(module_->context()));
    new_inst->SetInOperand(0, {to});
    module_->AddAnnotationInst(std::move(new_inst));
    auto decoration_iter = --module_->annotation_end();
    context->AnalyzeUses(&*decoration_iter);
  }

  // We need to copy the list of instructions as ForgetUses and AnalyzeUses are
  // going to modify it.
  std::vector<Instruction*> indirect_decorations =
      decoration_list->second.indirect_decorations;
  for (Instruction* inst : indirect_decorations) {
    switch (inst->opcode()) {
      case spv::Op::OpGroupDecorate:
        CloneDecorations(inst->GetSingleWordInOperand(0), to,
                         decorations_to_copy);
        break;
      case spv::Op::OpGroupMemberDecorate: {
        assert(false && "The source id is not suppose to be a type.");
        break;
      }
      default:
        assert(false && "Unexpected decoration instruction");
    }
  }
}